

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
* __thiscall
HighsCliqueTable::computeMaximalCliques
          (vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
           *__return_storage_ptr__,HighsCliqueTable *this,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *vars,
          double feastol)

{
  CliqueVar CVar1;
  pointer pCVar2;
  const_iterator __begin1;
  pointer pCVar3;
  CliqueVar *var_1;
  pointer pCVar4;
  const_iterator __end1;
  ulong uVar5;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *__range1;
  const_iterator __begin1_1;
  vector<double,_std::allocator<double>_> sol;
  _Vector_base<double,_std::allocator<double>_> local_108;
  undefined1 local_e8 [8];
  pointer local_e0;
  pointer pCStack_d8;
  pointer local_d0;
  pointer pCStack_c8;
  pointer local_c0;
  pointer pCStack_b8;
  pointer local_b0;
  pointer pCStack_a8;
  pointer local_a0;
  pointer pvStack_98;
  pointer local_90;
  pointer pvStack_88;
  pointer local_80;
  pointer piStack_78;
  pointer local_70;
  double dStack_68;
  double local_60;
  double local_58;
  HighsInt local_50;
  HighsInt local_4c;
  HighsInt local_48;
  int64_t local_40;
  int64_t local_38;
  
  pCVar3 = (vars->
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (vars->
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar3 == pCVar2) {
    (__return_storage_ptr__->
    super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    uVar5 = 0;
    for (; pCVar3 != pCVar2; pCVar3 = pCVar3 + 1) {
      if (uVar5 <= ((uint)*pCVar3 & 0x7fffffff)) {
        uVar5 = (ulong)((uint)*pCVar3 & 0x7fffffff);
      }
    }
    local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)&local_108,uVar5 + 1);
    pCVar2 = (vars->
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pCVar3 = (vars->
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (pCVar4 = pCVar3; pCVar4 != pCVar2; pCVar4 = pCVar4 + 1) {
      local_108._M_impl.super__Vector_impl_data._M_start[(uint)*pCVar4 & 0x7fffffff] =
           (double)((uint)*pCVar4 >> 0x1f);
    }
    local_e0 = (pointer)0x0;
    pCStack_d8 = (pointer)0x0;
    local_d0 = (pointer)0x0;
    pCStack_c8 = (pointer)0x0;
    local_c0 = (pointer)0x0;
    pCStack_b8 = (pointer)0x0;
    local_b0 = (pointer)0x0;
    pCStack_a8 = (pointer)0x0;
    local_a0 = (pointer)0x0;
    pvStack_98 = (pointer)0x0;
    local_90 = (pointer)0x0;
    pvStack_88 = (pointer)0x0;
    local_80 = (pointer)0x0;
    piStack_78 = (pointer)0x0;
    local_70 = (pointer)0x0;
    dStack_68 = 0.0;
    local_60 = 1.05;
    local_50 = 0;
    local_4c = 10000;
    local_48 = 100;
    local_40 = 0x7fffffffffffffff;
    local_38 = 0;
    local_e8 = (undefined1  [8])&local_108;
    local_58 = feastol;
    for (; pCVar3 != pCVar2; pCVar3 = pCVar3 + 1) {
      CVar1 = *pCVar3;
      if ((((this->colsubstituted).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(uint)CVar1 & 0x7fffffff] == 0) &&
          ((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start[(uint)CVar1 & 0x7fffffff] == '\0')) &&
         ((this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(int)((int)CVar1 << 1 | (uint)((int)CVar1 < 0))] != 0)) {
        std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
        emplace_back<HighsCliqueTable::CliqueVar_const&>
                  ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                    *)&local_e0,pCVar3);
      }
    }
    bronKerboschRecurse(this,(BronKerboschData *)local_e8,
                        (HighsInt)((ulong)((long)pCStack_d8 - (long)local_e0) >> 2),(CliqueVar *)0x0
                        ,0);
    (__return_storage_ptr__->
    super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = pvStack_98;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = local_90;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = pvStack_88;
    pvStack_98 = (pointer)0x0;
    local_90 = (pointer)0x0;
    pvStack_88 = (pointer)0x0;
    BronKerboschData::~BronKerboschData((BronKerboschData *)local_e8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_108);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<HighsCliqueTable::CliqueVar>>
HighsCliqueTable::computeMaximalCliques(const std::vector<CliqueVar>& vars,
                                        double feastol) {
  // return if there are no variables
  if (vars.empty())
    return std::vector<std::vector<HighsCliqueTable::CliqueVar>>{};

  // find max column index in clique variables
  size_t maxcolindex = 0;
  for (const auto& var : vars)
    maxcolindex = std::max(static_cast<size_t>(var.col), maxcolindex);

  // set up data
  std::vector<double> sol;
  sol.resize(maxcolindex + 1);
  for (const auto& var : vars) sol[var.col] = var.val;
  BronKerboschData data(sol);
  data.feastol = feastol;

  for (const auto& var : vars) {
    if (colsubstituted[var.col] || colDeleted[var.col]) continue;
    if (numCliques(var) != 0) data.P.emplace_back(var);
  }

  bronKerboschRecurse(data, data.P.size(), nullptr, 0);

  return std::move(data.cliques);
}